

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

CURLcode easy_connection(Curl_easy *data,curl_socket_t *sfd,connectdata **connp)

{
  curl_socket_t cVar1;
  char *fmt;
  
  if (data == (Curl_easy *)0x0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  if (((data->set).field_0x914 & 0x20) == 0) {
    fmt = "CONNECT_ONLY is required!";
  }
  else {
    cVar1 = Curl_getconnectinfo(data,connp);
    *sfd = cVar1;
    if (cVar1 != -1) {
      return CURLE_OK;
    }
    fmt = "Failed to get recent socket";
  }
  Curl_failf(data,fmt);
  return CURLE_UNSUPPORTED_PROTOCOL;
}

Assistant:

static CURLcode easy_connection(struct Curl_easy *data,
                                curl_socket_t *sfd,
                                struct connectdata **connp)
{
  if(data == NULL)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  /* only allow these to be called on handles with CURLOPT_CONNECT_ONLY */
  if(!data->set.connect_only) {
    failf(data, "CONNECT_ONLY is required!");
    return CURLE_UNSUPPORTED_PROTOCOL;
  }

  *sfd = Curl_getconnectinfo(data, connp);

  if(*sfd == CURL_SOCKET_BAD) {
    failf(data, "Failed to get recent socket");
    return CURLE_UNSUPPORTED_PROTOCOL;
  }

  return CURLE_OK;
}